

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

VkDeviceMemory __thiscall VmaAllocation_T::GetMemory(VmaAllocation_T *this)

{
  undefined8 *in_RDI;
  VkDeviceMemory local_8;
  
  if (*(char *)((long)in_RDI + 0x4c) == '\x01') {
    local_8 = VmaDeviceMemoryBlock::GetDeviceMemory((VmaDeviceMemoryBlock *)*in_RDI);
  }
  else if (*(char *)((long)in_RDI + 0x4c) == '\x02') {
    local_8 = (VkDeviceMemory)in_RDI[1];
  }
  else {
    local_8 = (VkDeviceMemory)0x0;
  }
  return local_8;
}

Assistant:

VkDeviceMemory VmaAllocation_T::GetMemory() const
{
    switch (m_Type)
    {
    case ALLOCATION_TYPE_BLOCK:
        return m_BlockAllocation.m_Block->GetDeviceMemory();
    case ALLOCATION_TYPE_DEDICATED:
        return m_DedicatedAllocation.m_hMemory;
    default:
        VMA_ASSERT(0);
        return VK_NULL_HANDLE;
    }
}